

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O3

uint32_t crc32_update(uint32_t crc,ptrlen data)

{
  uint uVar1;
  size_t sVar2;
  uint8_t *p;
  uint uVar3;
  uint uVar4;
  
  if (data.len != 0) {
    sVar2 = 0;
    do {
      uVar3 = *(byte *)((long)data.ptr + sVar2) ^ crc;
      uVar1 = uVar3 & 0xf;
      uVar3 = uVar1 * 0x11111044 ^ uVar3 >> 4;
      uVar4 = uVar3 & 0xf;
      crc = uVar4 * 0x4220000 ^ uVar4 * 0x8840020 ^
            uVar4 * 0x11111044 ^ (uVar1 * 0x4220000 ^ uVar1 * 0x8840020 ^ uVar3) >> 4;
      sVar2 = sVar2 + 1;
    } while (data.len != sVar2);
  }
  return crc;
}

Assistant:

uint32_t crc32_update(uint32_t crc, ptrlen data)
{
    const uint8_t *p = (const uint8_t *)data.ptr;
    for (size_t len = data.len; len-- > 0 ;)
        crc = crc32_shift_8(crc ^ *p++);
    return crc;
}